

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.h
# Opt level: O1

SolverStats * __thiscall Clasp::SharedContext::solverStats(SharedContext *this,uint32 sId)

{
  if (sId < (this->solvers_).ebo_.size) {
    return &(this->solvers_).ebo_.buf[sId]->stats;
  }
  Potassco::fail(-1,"SolverStats &Clasp::SharedContext::solverStats(uint32) const",0x446,
                 "hasSolver(sId)","solver id out of range",0);
}

Assistant:

bool       hasSolver(uint32 id) const { return id < solvers_.size(); }